

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

uint64_t __thiscall kratos::Context::get_hash(Context *this,Generator *generator)

{
  const_iterator cVar1;
  runtime_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pointer local_58;
  size_type sStack_50;
  string local_48;
  Generator *local_28;
  Generator *generator_local;
  
  local_48._M_dataplus._M_p = (pointer)generator;
  local_28 = generator;
  cVar1 = std::
          _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->generator_hash_)._M_h,(key_type *)&local_48);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_58 = (generator->name)._M_dataplus._M_p;
    sStack_50 = (generator->name)._M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x20;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_58;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_48,(detail *)"{0}\'s hash has not been computed",format_str,args);
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar1 = std::
          _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->generator_hash_)._M_h,&local_28);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_unsigned_long>,_false>.
      _M_cur != (__node_type *)0x0) {
    return *(uint64_t *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_kratos::Generator_*const,_unsigned_long>,_false>
                   ._M_cur + 0x10);
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

uint64_t Context::get_hash(const Generator *generator) const {
    if (!has_hash(generator))
        throw ::runtime_error(::format("{0}'s hash has not been computed", generator->name));
    return generator_hash_.at(generator);
}